

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_thread::
posix_thread<asio::detail::resolver_service_base::work_io_context_runner>
          (posix_thread *this,work_io_context_runner f,uint param_3)

{
  work_io_context_runner in_RDI;
  func<asio::detail::resolver_service_base::work_io_context_runner> *in_stack_ffffffffffffffb8;
  func_base *in_stack_ffffffffffffffd8;
  posix_thread *in_stack_ffffffffffffffe0;
  
  noncopyable::noncopyable((noncopyable *)in_RDI.io_context_);
  *(undefined1 *)&(in_RDI.io_context_)->impl_ = 0;
  operator_new(0x10);
  func<asio::detail::resolver_service_base::work_io_context_runner>::func
            (in_stack_ffffffffffffffb8,in_RDI);
  start_thread(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

posix_thread(Function f, unsigned int = 0)
    : joined_(false)
  {
    start_thread(new func<Function>(f));
  }